

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displ.cpp
# Opt level: O1

void __thiscall displ::createWindow(displ *this,string *str,uint x,uint y,uint antialiasing)

{
  RenderTarget *this_00;
  View *this_01;
  locale local_80 [8];
  VideoMode local_78;
  undefined1 local_68 [12];
  float local_5c;
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  local_58;
  ContextSettings local_48;
  
  local_48.depthBits = 0;
  local_48.stencilBits = 0;
  local_48.minorVersion = 1;
  local_48.attributeFlags = 0;
  local_48.sRgbCapable = false;
  local_48.majorVersion = 1;
  local_48.antialiasingLevel = antialiasing;
  sf::VideoMode::VideoMode(&local_78,x,y,0x20);
  std::locale::locale(local_80);
  sf::String::String((String *)local_68,str,local_80);
  sf::Window::create((Window *)this,local_78,(String *)local_68,7,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity * 4 + 4);
  }
  std::locale::~locale(local_80);
  this_01 = &this->view;
  local_68._8_4_ = (undefined4)x;
  local_5c = (float)y;
  local_68._0_8_ = (pointer)0x0;
  sf::View::reset(this_01,(FloatRect *)local_68);
  this_00 = &(this->window).super_RenderTarget;
  sf::RenderTarget::setView(this_00,this_01);
  sf::RenderTarget::clear(this_00,(Color *)&sf::Color::Black);
  sf::Window::display((Window *)this);
  sf::View::zoom(this_01,0.3);
  sf::RenderTarget::setView(this_00,this_01);
  sf::View::setCenter(this_01,(this->box).x * 0.5,(this->box).y * 0.5);
  sf::RenderTarget::setView(this_00,this_01);
  return;
}

Assistant:

void displ::createWindow(std::string str, unsigned x, unsigned y, unsigned antialiasing)
{
	sf::ContextSettings settings;
	//Z antyaliasingiem 0 działa bardzo szybko ale brzydko
	settings.antialiasingLevel = antialiasing;
	window.create(sf::VideoMode(x,y), str,sf::Style::Default, settings);	
	
	view.reset(sf::FloatRect( 0, 0, x, y));
	window.setView(view);
	
	window.clear(sf::Color::Black);
	window.display();

	zoom(0.3f);
    setCenter(box.getX()/2.f, box.getY()/2.f);
}